

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

void Mf_ManPrintStats(Mf_Man_t *p,char *pTitle)

{
  long lVar1;
  int iVar2;
  long lVar3;
  timespec ts;
  timespec local_20;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ");
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    printf("Edge =%9lu   ",p->pPars->Edge);
    if (p->pPars->fGenCnf != 0) {
      printf("CNF =%9lu   ",p->pPars->Clause);
    }
    iVar2 = clock_gettime(3,&local_20);
    if (iVar2 < 0) {
      lVar3 = -1;
    }
    else {
      lVar3 = local_20.tv_nsec / 1000 + local_20.tv_sec * 1000000;
    }
    lVar1 = p->clkStart;
    Abc_Print(1,"%s =","Time");
    Abc_Print(1,"%9.2f sec\n",(double)(lVar3 - lVar1) / 1000000.0);
    fflush(_stdout);
  }
  return;
}

Assistant:

void Mf_ManPrintStats( Mf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ",   (long)p->pPars->Delay );
    printf( "Area =%9lu   ",  (long)p->pPars->Area );
    printf( "Edge =%9lu   ",  (long)p->pPars->Edge );
    if ( p->pPars->fGenCnf )
        printf( "CNF =%9lu   ", (long)p->pPars->Clause );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}